

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O1

void __thiscall cpp_sgr::color::color(color *this,ANSIColor code,bool foreground)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  ANSIColor __val;
  ANSIColor AVar4;
  uint __len;
  string __str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  AVar4 = code + 10;
  if ((int)CONCAT71(in_register_00000011,foreground) != 0) {
    AVar4 = code;
  }
  __val = -AVar4;
  if (0 < (int)AVar4) {
    __val = AVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_001042ea;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_001042ea;
      }
      if (uVar2 < 10000) goto LAB_001042ea;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_001042ea:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)AVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(AVar4 >> 0x1f) + (long)local_50),__len,__val);
  (this->super_sgr).str._M_dataplus._M_p = (pointer)&(this->super_sgr).str.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

color(const ANSIColor code, bool foreground) :
			sgr(std::to_string(foreground ? code : (code + 10)))
		{}